

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall cmCPackGenerator::InstallProject(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined4 extraout_var;
  char *local_5b0;
  allocator local_519;
  string local_518;
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478;
  allocator local_451;
  undefined1 local_450 [8];
  string destDir;
  string local_428 [32];
  undefined1 local_408 [8];
  ostringstream cmCPackLog_msg_1;
  int res;
  char *tempInstallDirectory;
  string local_278;
  allocator local_251;
  string local_250;
  byte local_229;
  string local_228 [7];
  bool setDestDir;
  string tempInstallDirectoryStr;
  string local_200;
  string local_1e0 [8];
  string bareTempInstallDirectory;
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  cmCPackGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar6 = std::operator<<((ostream *)local_190,"Install projects");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0xc0,pcVar7);
  std::__cxx11::string::~string((string *)(bareTempInstallDirectory.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_190);
  CleanTemporaryDirectory(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_200,"CPACK_TEMPORARY_INSTALL_DIRECTORY",
             (allocator *)(tempInstallDirectoryStr.field_2._M_local_buf + 0xf));
  pcVar7 = GetOption(this,&local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e0,pcVar7,(allocator *)(tempInstallDirectoryStr.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)(tempInstallDirectoryStr.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator
            ((allocator<char> *)(tempInstallDirectoryStr.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string(local_228,local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"CPACK_SET_DESTDIR",&local_251);
  pcVar7 = GetOption(this,&local_250);
  bVar3 = cmSystemTools::IsOn(pcVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_278,"CPACK_SET_DESTDIR",(allocator *)((long)&tempInstallDirectory + 7)
            );
  pcVar7 = GetOption(this,&local_278);
  bVar4 = cmSystemTools::IsInternallyOn(pcVar7);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tempInstallDirectory + 7));
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  local_229 = bVar3 || bVar4;
  if (!bVar3 && !bVar4) {
    iVar5 = (*(this->super_cmObject)._vptr_cmObject[0xc])();
    std::__cxx11::string::operator+=(local_228,(char *)CONCAT44(extraout_var,iVar5));
  }
  local_5b0 = (char *)std::__cxx11::string::c_str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  bVar3 = cmsys::SystemTools::MakeDirectory(pcVar7);
  if (bVar3) {
    if ((local_229 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_478,"DESTDIR=",&local_479);
      cmsys::SystemTools::PutEnv(&local_478);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_450,"DESTDIR=",&local_451);
      std::allocator<char>::~allocator((allocator<char> *)&local_451);
      std::__cxx11::string::operator+=((string *)local_450,local_5b0);
      cmsys::SystemTools::PutEnv((string *)local_450);
      std::__cxx11::string::~string((string *)local_450);
    }
    bVar2 = local_229;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,local_5b0,&local_4a1);
    iVar5 = (*(this->super_cmObject)._vptr_cmObject[0x11])(this,(ulong)(bVar2 & 1),local_4a0);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    bVar2 = local_229;
    if (iVar5 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4c8,local_5b0,&local_4c9);
      iVar5 = (*(this->super_cmObject)._vptr_cmObject[0x12])(this,(ulong)(bVar2 & 1),local_4c8);
      std::__cxx11::string::~string(local_4c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
      bVar2 = local_229;
      if (iVar5 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4f0,local_5b0,&local_4f1);
        iVar5 = (*(this->super_cmObject)._vptr_cmObject[0x13])(this,(ulong)(bVar2 & 1),local_4f0);
        std::__cxx11::string::~string(local_4f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
        if (iVar5 == 0) {
          this_local._4_4_ = 0;
        }
        else {
          iVar5 = (*(this->super_cmObject)._vptr_cmObject[0x14])
                            (this,(ulong)(local_229 & 1),local_1e0);
          if (iVar5 == 0) {
            this_local._4_4_ = 0;
          }
          else {
            if ((local_229 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_518,"DESTDIR=",&local_519);
              cmsys::SystemTools::PutEnv(&local_518);
              std::__cxx11::string::~string((string *)&local_518);
              std::allocator<char>::~allocator((allocator<char> *)&local_519);
            }
            this_local._4_4_ = 1;
          }
        }
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
    poVar6 = std::operator<<((ostream *)local_408,"Problem creating temporary directory: ");
    if (local_5b0 == (char *)0x0) {
      local_5b0 = "(NULL)";
    }
    poVar6 = std::operator<<(poVar6,local_5b0);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0xd5,pcVar7);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
    this_local._4_4_ = 0;
  }
  destDir.field_2._12_4_ = 1;
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_1e0);
  return this_local._4_4_;
}

Assistant:

int cmCPackGenerator::InstallProject()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Install projects" << std::endl);
  this->CleanTemporaryDirectory();

  std::string bareTempInstallDirectory
    = this->GetOption("CPACK_TEMPORARY_INSTALL_DIRECTORY");
  std::string tempInstallDirectoryStr = bareTempInstallDirectory;
  bool setDestDir = cmSystemTools::IsOn(this->GetOption("CPACK_SET_DESTDIR"))
                  | cmSystemTools::IsInternallyOn(
                    this->GetOption("CPACK_SET_DESTDIR"));
  if (!setDestDir)
    {
    tempInstallDirectoryStr += this->GetPackagingInstallPrefix();
    }

  const char* tempInstallDirectory = tempInstallDirectoryStr.c_str();
  int res = 1;
  if ( !cmsys::SystemTools::MakeDirectory(bareTempInstallDirectory.c_str()))
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
      "Problem creating temporary directory: "
                  << (tempInstallDirectory ? tempInstallDirectory : "(NULL)")
                  << std::endl);
    return 0;
    }

  if ( setDestDir )
    {
    std::string destDir = "DESTDIR=";
    destDir += tempInstallDirectory;
    cmSystemTools::PutEnv(destDir);
    }
  else
    {
    // Make sure there is no destdir
    cmSystemTools::PutEnv("DESTDIR=");
    }

  // If the CPackConfig file sets CPACK_INSTALL_COMMANDS then run them
  // as listed
  if ( !this->InstallProjectViaInstallCommands(
      setDestDir, tempInstallDirectory) )
    {
    return 0;
    }

  // If the CPackConfig file sets CPACK_INSTALL_SCRIPT then run them
  // as listed
  if ( !this->InstallProjectViaInstallScript(
      setDestDir, tempInstallDirectory) )
    {
    return 0;
    }

  // If the CPackConfig file sets CPACK_INSTALLED_DIRECTORIES
  // then glob it and copy it to CPACK_TEMPORARY_DIRECTORY
  // This is used in Source packaging
  if ( !this->InstallProjectViaInstalledDirectories(
      setDestDir, tempInstallDirectory) )
    {
    return 0;
    }


  // If the project is a CMAKE project then run pre-install
  // and then read the cmake_install script to run it
  if ( !this->InstallProjectViaInstallCMakeProjects(
         setDestDir, bareTempInstallDirectory) )
    {
    return 0;
    }

  if ( setDestDir )
    {
    cmSystemTools::PutEnv("DESTDIR=");
    }

  return res;
}